

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall
Engine::Engine(Engine *this,string *prefix,
              unique_ptr<Handler,_std::default_delete<Handler>_> *handler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->prefix).field_2;
  (this->prefix)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  paVar2 = &prefix->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&prefix->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->prefix).field_2 + 8) = uVar4;
  }
  else {
    (this->prefix)._M_dataplus._M_p = pcVar3;
    (this->prefix).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->prefix)._M_string_length = prefix->_M_string_length;
  (prefix->_M_dataplus)._M_p = (pointer)paVar2;
  prefix->_M_string_length = 0;
  (prefix->field_2)._M_local_buf[0] = '\0';
  (this->handlers).
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->handlers).
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->handlers).
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&this->handlers,handler);
  return;
}

Assistant:

Engine::Engine(std::string prefix, std::unique_ptr<Handler> handler) : prefix(std::move(prefix)) {
    handlers.push_back(std::move(handler));
}